

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O2

string * __thiscall
VulkanHppGenerator::generateRAIIHandleCommand
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *command,
          size_t initialSkipCount,bool definition)

{
  bool bVar1;
  const_iterator cVar2;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar1 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::contains(&this->m_RAIISpecialFunctions,command);
  if (!bVar1) {
    cVar2 = anon_unknown.dwarf_dd40c::findByNameOrAlias<VulkanHppGenerator::CommandData>
                      (&this->m_commands,command);
    if ((_Rb_tree_header *)cVar2._M_node == &(this->m_commands)._M_t._M_impl.super__Rb_tree_header)
    {
      __assert_fail("commandIt != m_commands.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]Vulkan-Hpp/VulkanHppGenerator.cpp"
                    ,0x2357,
                    "std::string VulkanHppGenerator::generateRAIIHandleCommand(const std::string &, size_t, bool) const"
                   );
    }
    generateCommand(&local_48,this,command,(CommandData *)(cVar2._M_node + 2),initialSkipCount,
                    definition,true);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateRAIIHandleCommand( std::string const & command, size_t initialSkipCount, bool definition ) const
{
  std::string str;
  if ( !m_RAIISpecialFunctions.contains( command ) )
  {
    auto commandIt = findByNameOrAlias( m_commands, command );
    assert( commandIt != m_commands.end() );
    str = generateCommand( command, commandIt->second, initialSkipCount, definition, true );
  }
  return str;
}